

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
Chainstate::ResizeCoinsCaches(Chainstate *this,size_t coinstip_size,size_t coinsdb_size)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  Level level;
  BlockValidationState state;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = this->m_coinstip_cache_size_bytes;
  if ((uVar5 != coinstip_size) || (bVar6 = true, this->m_coinsdb_cache_size_bytes != coinsdb_size))
  {
    this->m_coinstip_cache_size_bytes = coinstip_size;
    this->m_coinsdb_cache_size_bytes = coinsdb_size;
    puVar7 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                       (&this->m_coins_views,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                        ,0x277,"CoinsDB","m_coins_views");
    CCoinsViewDB::ResizeCache
              (&((puVar7->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>.
                 _M_t.super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl)->m_dbview,coinsdb_size);
    ToString_abi_cxx11_((string *)&state,this);
    auVar8._8_4_ = (int)(coinsdb_size >> 0x20);
    auVar8._0_8_ = coinsdb_size;
    auVar8._12_4_ = 0x45300000;
    level = (Level)(string *)&state;
    logging_function._M_str = "ResizeCoinsCaches";
    logging_function._M_len = 0x11;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<std::__cxx11::string,double>
              (logging_function,source_file,0x15aa,0x1000ddd,level,&stack0xffffffffffffff78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)coinsdb_size) - 4503599627370496.0)) *
               9.5367431640625e-07),
               (double *)state.super_ValidationState<BlockValidationResult>._0_8_);
    psVar1 = &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
    if ((size_type *)state.super_ValidationState<BlockValidationResult>._0_8_ != psVar1) {
      operator_delete((void *)state.super_ValidationState<BlockValidationResult>._0_8_,
                      state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                      _M_string_length + 1);
    }
    ToString_abi_cxx11_((string *)&state,this);
    auVar9._8_4_ = (int)(coinstip_size >> 0x20);
    auVar9._0_8_ = coinstip_size;
    auVar9._12_4_ = 0x45300000;
    logging_function_00._M_str = "ResizeCoinsCaches";
    logging_function_00._M_len = 0x11;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_00._M_len = 0x57;
    LogPrintf_<std::__cxx11::string,double>
              (logging_function_00,source_file_00,0x15ac,0x1000e05,level,&stack0xffffffffffffff78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)coinstip_size) - 4503599627370496.0)) *
               9.5367431640625e-07),
               (double *)state.super_ValidationState<BlockValidationResult>._0_8_);
    if ((size_type *)state.super_ValidationState<BlockValidationResult>._0_8_ != psVar1) {
      operator_delete((void *)state.super_ValidationState<BlockValidationResult>._0_8_,
                      state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                      _M_string_length + 1);
    }
    paVar2 = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
         '\0';
    paVar3 = &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)paVar2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)paVar3;
    bVar6 = FlushStateToDisk(this,&state,(uint)(coinstip_size <= uVar5) * 2 + IF_NEEDED,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        paVar3) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
        paVar2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ResizeCoinsCaches(size_t coinstip_size, size_t coinsdb_size)
{
    AssertLockHeld(::cs_main);
    if (coinstip_size == m_coinstip_cache_size_bytes &&
            coinsdb_size == m_coinsdb_cache_size_bytes) {
        // Cache sizes are unchanged, no need to continue.
        return true;
    }
    size_t old_coinstip_size = m_coinstip_cache_size_bytes;
    m_coinstip_cache_size_bytes = coinstip_size;
    m_coinsdb_cache_size_bytes = coinsdb_size;
    CoinsDB().ResizeCache(coinsdb_size);

    LogPrintf("[%s] resized coinsdb cache to %.1f MiB\n",
        this->ToString(), coinsdb_size * (1.0 / 1024 / 1024));
    LogPrintf("[%s] resized coinstip cache to %.1f MiB\n",
        this->ToString(), coinstip_size * (1.0 / 1024 / 1024));

    BlockValidationState state;
    bool ret;

    if (coinstip_size > old_coinstip_size) {
        // Likely no need to flush if cache sizes have grown.
        ret = FlushStateToDisk(state, FlushStateMode::IF_NEEDED);
    } else {
        // Otherwise, flush state to disk and deallocate the in-memory coins map.
        ret = FlushStateToDisk(state, FlushStateMode::ALWAYS);
    }
    return ret;
}